

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void dLog(uint indent,char *format,...)

{
  undefined1 *puVar1;
  char in_AL;
  __va_list_tag *in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  __va_list_tag *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  char local_78 [8];
  va_list args;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  args[0].overflow_arg_area = local_128;
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  args[0]._0_8_ = &stack0x00000008;
  local_78[0] = '\x10';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_40[0] = local_30;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)indent * '\x02');
  puVar1 = local_40[0];
  chatra::formatTextV_abi_cxx11_((string *)&args[0].reg_save_area,(chatra *)format,local_78,in_RCX);
  printf("%s%s\n",puVar1,args[0].reg_save_area);
  std::__cxx11::string::~string((string *)&args[0].reg_save_area);
  std::__cxx11::string::~string((string *)local_40);
  fflush(_stdout);
  return;
}

Assistant:

static void dLog(unsigned indent, const char* format, ...) {
	va_list args;
	va_start(args, format);
	std::printf("%s%s\n", std::string(indent * 2, ' ').data(), cha::formatTextV(format, args).data());
	std::fflush(stdout);
	va_end(args);
}